

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O3

void __thiscall Ptex::v2_2::PtexReader::readEditData(PtexReader *this)

{
  ulong uVar1;
  int iVar2;
  ulong in_RAX;
  long lVar3;
  ulong uVar4;
  uint8_t edittype;
  uint32_t editsize;
  undefined8 uStack_38;
  
  lVar3 = this->_editdatapos;
  uVar4 = -(ulong)((this->_extheader).editdatapos == 0) | (this->_extheader).editdatasize + lVar3;
  if (lVar3 < (long)uVar4) {
    uStack_38 = in_RAX;
    do {
      seek(this,lVar3);
      uStack_38._0_4_ = CONCAT13(1,(undefined3)uStack_38);
      if (this->_fp == (Handle)0x0) break;
      iVar2 = (*this->_io->_vptr_PtexInputHandler[4])(this->_io,(long)&uStack_38 + 3,1);
      if (iVar2 != 1) break;
      this->_pos = this->_pos + 1;
      if (this->_fp == (Handle)0x0) break;
      iVar2 = (*this->_io->_vptr_PtexInputHandler[4])(this->_io,(long)&uStack_38 + 4,4);
      if (iVar2 != 4) break;
      lVar3 = this->_pos + 4;
      this->_pos = lVar3;
      uVar1 = uStack_38 >> 0x20;
      if (uVar1 == 0) break;
      this->_hasEdits = true;
      if (uStack_38._3_1_ == '\x01') {
        readEditMetaData(this);
      }
      else if (uStack_38._3_1_ == '\0') {
        readEditFaceData(this);
      }
      lVar3 = lVar3 + uVar1;
    } while (lVar3 < (long)uVar4);
  }
  uVar4 = (long)(this->_metaedits).
                super__Vector_base<Ptex::v2_2::PtexReader::MetaEdit,_std::allocator<Ptex::v2_2::PtexReader::MetaEdit>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage +
          ((long)&((this->_faceedits).
                   super__Vector_base<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->pos -
          ((long)&((this->_metaedits).
                   super__Vector_base<Ptex::v2_2::PtexReader::MetaEdit,_std::allocator<Ptex::v2_2::PtexReader::MetaEdit>_>
                   ._M_impl.super__Vector_impl_data._M_start)->pos +
          (long)&((this->_faceedits).
                  super__Vector_base<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
                  ._M_impl.super__Vector_impl_data._M_start)->pos)) & 0xfffffffffffffff0;
  if (uVar4 != 0) {
    LOCK();
    this->_memUsed = this->_memUsed + uVar4;
    UNLOCK();
  }
  return;
}

Assistant:

void PtexReader::readEditData()
{
    // determine file range to scan for edits
    FilePos pos = FilePos(_editdatapos), endpos;
    if (_extheader.editdatapos > 0) {
        // newer files record the edit data position and size in the extheader
        // note: position will be non-zero even if size is zero
        endpos = FilePos(pos + _extheader.editdatasize);
    }
    else {
        // must have an older file, just read until EOF
        endpos = FilePos((uint64_t)-1);
    }

    while (pos < endpos) {
        seek(pos);
        // read the edit data header
        uint8_t edittype = et_editmetadata;
        uint32_t editsize;
        if (!readBlock(&edittype, sizeof(edittype), /*reporterror*/ false)) break;
        if (!readBlock(&editsize, sizeof(editsize), /*reporterror*/ false)) break;
        if (!editsize) break;
        _hasEdits = true;
        pos = tell() + editsize;
        switch (edittype) {
        case et_editfacedata:   readEditFaceData(); break;
        case et_editmetadata:   readEditMetaData(); break;
        }
    }
    increaseMemUsed(sizeof(_faceedits[0]) * _faceedits.capacity() +
                    sizeof(_metaedits[0]) * _metaedits.capacity());
}